

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * FxConstant::MakeConstant(PSymbol *sym,FScriptPosition *pos)

{
  PClass *pPVar1;
  PSymbolConstNumeric *pPVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  FxConstant *pFVar5;
  char *message;
  
  pPVar2 = dyn_cast<PSymbolConstNumeric>(&sym->super_DObject);
  pPVar4 = PInt::RegistrationInfo.MyClass;
  if (pPVar2 == (PSymbolConstNumeric *)0x0) {
    message = "\'%s\' is not a constant\n";
  }
  else {
    pPVar3 = DObject::GetClass(&((pPVar2->super_PSymbolConst).ValueType)->super_DObject);
    pPVar1 = PFloat::RegistrationInfo.MyClass;
    if (pPVar3 == pPVar4) {
      pFVar5 = (FxConstant *)operator_new(0x48);
      FxConstant(pFVar5,(pPVar2->field_0).Value,pos);
      return &pFVar5->super_FxExpression;
    }
    pPVar4 = DObject::GetClass(&((pPVar2->super_PSymbolConst).ValueType)->super_DObject);
    if (pPVar4 == pPVar1) {
      pFVar5 = (FxConstant *)operator_new(0x48);
      FxConstant(pFVar5,(pPVar2->field_0).Float,pos);
      return &pFVar5->super_FxExpression;
    }
    message = "Invalid constant \'%s\'\n";
    sym = (PSymbol *)pPVar2;
  }
  FScriptPosition::Message
            (pos,2,message,
             FName::NameData.NameArray
             [*(int *)&(((PSymbolConstNumeric *)sym)->super_PSymbolConst).super_PSymbol.
                       super_DObject.field_0x24].Text);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxConstant::MakeConstant(PSymbol *sym, const FScriptPosition &pos)
{
	FxExpression *x;
	PSymbolConstNumeric *csym = dyn_cast<PSymbolConstNumeric>(sym);
	if (csym != NULL)
	{
		if (csym->ValueType->IsA(RUNTIME_CLASS(PInt)))
		{
			x = new FxConstant(csym->Value, pos);
		}
		else if (csym->ValueType->IsA(RUNTIME_CLASS(PFloat)))
		{
			x = new FxConstant(csym->Float, pos);
		}
		else
		{
			pos.Message(MSG_ERROR, "Invalid constant '%s'\n", csym->SymbolName.GetChars());
			return NULL;
		}
	}
	else
	{
		pos.Message(MSG_ERROR, "'%s' is not a constant\n", sym->SymbolName.GetChars());
		x = NULL;
	}
	return x;
}